

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Aig_Man_t * Abc_NtkToDar(Abc_Ntk_t *pNtk,int fExors,int fRegisters)

{
  ulong *puVar1;
  byte *pbVar2;
  void *pvVar3;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar4;
  long *plVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  Aig_Man_t *p;
  char *pcVar8;
  Abc_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Vec_Ptr_t *pVVar14;
  void **ppvVar15;
  void *__dest;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  Aig_Man_t *pAVar20;
  long lVar21;
  uint uVar22;
  size_t __size;
  size_t __size_00;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  if (fRegisters != 0) {
    pVVar11 = pNtk->vBoxes;
    if (pVVar11->nSize != pNtk->nObjCounts[8]) {
      __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0xf3,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
    }
    lVar18 = (long)pNtk->vCis->nSize;
    if (0 < lVar18) {
      lVar21 = 0;
      do {
        uVar22 = *(uint *)((long)pNtk->vCis->pArray[lVar21] + 0x14) & 0xf;
        if (lVar21 < pNtk->vPis->nSize) {
          if (uVar22 != 2) {
            __assert_fail("Abc_ObjIsPi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                          ,0xf7,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
          }
        }
        else if (uVar22 != 5) {
          __assert_fail("Abc_ObjIsBo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0xfc,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
        lVar21 = lVar21 + 1;
      } while (lVar18 != lVar21);
    }
    lVar18 = (long)pNtk->vCos->nSize;
    if (0 < lVar18) {
      lVar21 = 0;
      do {
        uVar22 = *(uint *)((long)pNtk->vCos->pArray[lVar21] + 0x14) & 0xf;
        if (lVar21 < pNtk->vPos->nSize) {
          if (uVar22 != 3) {
            __assert_fail("Abc_ObjIsPo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                          ,0x100,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
          }
        }
        else if (uVar22 != 4) {
          __assert_fail("Abc_ObjIsBi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0x105,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
        lVar21 = lVar21 + 1;
      } while (lVar18 != lVar21);
    }
    if (0 < pVVar11->nSize) {
      lVar18 = 0;
      iVar17 = 0;
      do {
        pvVar3 = pVVar11->pArray[lVar18];
        uVar22 = *(uint *)((long)pvVar3 + 0x14) & 0xf;
        if ((uVar22 == 8) && (*(long *)((long)pvVar3 + 0x38) == 3)) {
          *(undefined8 *)((long)pvVar3 + 0x38) = 1;
          iVar17 = iVar17 + 1;
          pVVar11 = pNtk->vBoxes;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < pVVar11->nSize);
      if (iVar17 != 0) {
        Abc_Print(uVar22,"Warning: %d registers in this network have don\'t-care init values.\n");
        Abc_Print(uVar22,"The don\'t-care are assumed to be 0. The result may not verify.\n");
        Abc_Print(uVar22,"Use command \"print_latch\" to see the init values of registers.\n");
        Abc_Print(uVar22,"Use command \"zero\" to convert or \"init\" to change the values.\n");
      }
    }
  }
  p = Aig_ManStart(pNtk->nObjCounts[7] + 100);
  p->fCatchExor = fExors;
  iVar17 = pNtk->nBarBufs;
  p->nConstrs = pNtk->nConstrs;
  p->nBarBufs = iVar17;
  pcVar8 = Extra_UtilStrsav(pNtk->pName);
  p->pName = pcVar8;
  pcVar8 = Extra_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar8;
  aVar4 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar9 = Abc_AigConst1(pNtk);
  pAVar9->field_6 = aVar4;
  pVVar11 = pNtk->vCis;
  if (0 < pVVar11->nSize) {
    lVar18 = 0;
    do {
      pvVar3 = pVVar11->pArray[lVar18];
      pAVar10 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar3 + 0x40) = pAVar10;
      *(ulong *)&pAVar10->field_0x18 =
           *(ulong *)&pAVar10->field_0x18 & 0xff000000ffffffff |
           (ulong)(*(uint *)((long)pvVar3 + 0x14) >> 0xc) << 0x20;
      lVar18 = lVar18 + 1;
      pVVar11 = pNtk->vCis;
    } while (lVar18 < pVVar11->nSize);
  }
  if ((fRegisters != 0) && (pVVar11 = pNtk->vBoxes, 0 < pVVar11->nSize)) {
    lVar18 = 0;
    do {
      plVar5 = (long *)pVVar11->pArray[lVar18];
      if (((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) && (plVar5[7] == 2)) {
        puVar1 = (ulong *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                    (long)*(int *)plVar5[6] * 8) + 0x40);
        *puVar1 = *puVar1 ^ 1;
        pVVar11 = pNtk->vBoxes;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar11->nSize);
  }
  pVVar11 = Abc_NtkDfs(pNtk,0);
  if (0 < pVVar11->nSize) {
    lVar18 = 0;
    do {
      plVar5 = (long *)pVVar11->pArray[lVar18];
      lVar21 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
      pAVar10 = Aig_And(p,(Aig_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(lVar21 + (long)*(int *)plVar5[4] * 8) + 0x40)),
                        (Aig_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 0xb & 1) ^
                        *(ulong *)(*(long *)(lVar21 + (long)((int *)plVar5[4])[1] * 8) + 0x40)));
      plVar5[8] = (long)pAVar10;
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar11->nSize);
  }
  if (pVVar11->pArray != (void **)0x0) {
    free(pVVar11->pArray);
  }
  free(pVVar11);
  p->fAddStrash = 0;
  pVVar11 = pNtk->vCos;
  if (0 < pVVar11->nSize) {
    lVar18 = 0;
    do {
      plVar5 = (long *)pVVar11->pArray[lVar18];
      Aig_ObjCreateCo(p,(Aig_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                            (long)*(int *)plVar5[4] * 8) + 0x40)));
      lVar18 = lVar18 + 1;
      pVVar11 = pNtk->vCos;
    } while (lVar18 < pVVar11->nSize);
  }
  Aig_ManSetRegNum(p,pNtk->nObjCounts[8]);
  if (fRegisters != 0) {
    uVar22 = p->nObjs[3] - p->nRegs;
    pVVar11 = p->vCos;
    iVar17 = pVVar11->nSize;
    if ((int)uVar22 < iVar17) {
      uVar19 = (ulong)uVar22;
      do {
        if (((int)uVar22 < 0) || (pNtk->vCos->nSize <= (int)uVar19)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        plVar5 = (long *)pNtk->vCos->pArray[uVar19];
        lVar18 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8);
        if ((*(uint *)(lVar18 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a9,"int Abc_LatchIsInit1(Abc_Obj_t *)");
        }
        if (*(long *)(lVar18 + 0x38) == 2) {
          pbVar2 = (byte *)((long)pVVar11->pArray[uVar19] + 8);
          *pbVar2 = *pbVar2 ^ 1;
        }
        uVar19 = uVar19 + 1;
      } while ((int)uVar19 < iVar17);
    }
  }
  iVar17 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar17 == 0) {
    pAVar20 = p;
    uVar22 = Aig_ManCleanup(p);
    if ((fExors == 0) && (uVar22 != 0)) {
      Abc_Print((int)pAVar20,
                "Abc_NtkToDar(): Unexpected %d dangling nodes when converting to AIG!\n",
                (ulong)uVar22);
    }
  }
  if (fRegisters != 0) {
    Aig_ManSetRegNum(p,pNtk->nObjCounts[8]);
    uVar22 = p->nRegs;
    pVVar12 = (Vec_Int_t *)malloc(0x10);
    uVar7 = 0x10;
    if (0xe < uVar22 - 1) {
      uVar7 = uVar22;
    }
    pVVar12->nCap = uVar7;
    if (uVar7 == 0) {
      piVar13 = (int *)0x0;
    }
    else {
      piVar13 = (int *)malloc((long)(int)uVar7 << 2);
    }
    pVVar12->pArray = piVar13;
    pVVar12->nSize = uVar22;
    auVar6 = _DAT_0093d220;
    if (0 < (int)uVar22) {
      lVar18 = (ulong)uVar22 - 1;
      auVar23._8_4_ = (int)lVar18;
      auVar23._0_8_ = lVar18;
      auVar23._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar19 = 0;
      auVar23 = auVar23 ^ _DAT_0093d220;
      auVar24 = _DAT_0093d210;
      do {
        auVar25 = auVar24 ^ auVar6;
        if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                    auVar23._4_4_ < auVar25._4_4_) & 1)) {
          piVar13[uVar19] = (int)uVar19;
        }
        if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
            auVar25._12_4_ <= auVar23._12_4_) {
          piVar13[uVar19 + 1] = (int)uVar19 + 1;
        }
        uVar19 = uVar19 + 2;
        lVar18 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 2;
        auVar24._8_8_ = lVar18 + 2;
      } while ((uVar22 + 1 & 0xfffffffe) != uVar19);
    }
    p->vFlopNums = pVVar12;
    pVVar11 = pNtk->vOnehots;
    if (pVVar11 != (Vec_Ptr_t *)0x0) {
      iVar17 = pVVar11->nSize;
      pVVar14 = (Vec_Ptr_t *)malloc(0x10);
      iVar16 = 8;
      if (6 < iVar17 - 1U) {
        iVar16 = iVar17;
      }
      pVVar14->nSize = 0;
      pVVar14->nCap = iVar16;
      if (iVar16 == 0) {
        ppvVar15 = (void **)0x0;
      }
      else {
        ppvVar15 = (void **)malloc((long)iVar16 << 3);
      }
      pVVar14->pArray = ppvVar15;
      if (0 < iVar17) {
        __size_00 = 0;
        uVar19 = 0;
        do {
          pvVar3 = pVVar11->pArray[uVar19];
          piVar13 = (int *)malloc(0x10);
          iVar17 = *(int *)((long)pvVar3 + 4);
          piVar13[1] = iVar17;
          *piVar13 = iVar17;
          if ((long)iVar17 == 0) {
            __size = 0;
            __dest = (void *)0x0;
          }
          else {
            __size = (long)iVar17 << 2;
            __dest = malloc(__size);
          }
          *(void **)(piVar13 + 2) = __dest;
          memcpy(__dest,*(void **)((long)pvVar3 + 8),__size);
          if ((int)uVar19 == iVar16) {
            ppvVar15 = pVVar14->pArray;
            if (uVar19 < 0x10) {
              if (ppvVar15 == (void **)0x0) {
                ppvVar15 = (void **)malloc(0x80);
              }
              else {
                ppvVar15 = (void **)realloc(ppvVar15,0x80);
              }
              pVVar14->pArray = ppvVar15;
              iVar16 = 0x10;
            }
            else {
              if (ppvVar15 == (void **)0x0) {
                ppvVar15 = (void **)malloc(__size_00);
              }
              else {
                ppvVar15 = (void **)realloc(ppvVar15,__size_00);
              }
              pVVar14->pArray = ppvVar15;
              iVar16 = iVar16 * 2;
            }
          }
          else {
            ppvVar15 = pVVar14->pArray;
          }
          ppvVar15[uVar19] = piVar13;
          uVar19 = uVar19 + 1;
          __size_00 = __size_00 + 0x10;
        } while ((long)uVar19 < (long)pVVar11->nSize);
        pVVar14->nSize = (int)uVar19;
        pVVar14->nCap = iVar16;
      }
      p->vOnehots = pVVar14;
    }
  }
  pAVar20 = p;
  iVar17 = Aig_ManCheck(p);
  if (iVar17 == 0) {
    Abc_Print((int)pAVar20,"Abc_NtkToDar: AIG check has failed.\n");
    Aig_ManStop(p);
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters )
{
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pMan;
    Aig_Obj_t * pObjNew;
    Abc_Obj_t * pObj;
    int i, nNodes, nDontCares;
    // make sure the latches follow PIs/POs
    if ( fRegisters ) 
    { 
        assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            if ( i < Abc_NtkPiNum(pNtk) )
            {
                assert( Abc_ObjIsPi(pObj) );
                if ( !Abc_ObjIsPi(pObj) )
                    Abc_Print( 1, "Abc_NtkToDar(): Temporary bug: The PI ordering is wrong!\n" );
            }
            else
                assert( Abc_ObjIsBo(pObj) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            if ( i < Abc_NtkPoNum(pNtk) )
            {
                assert( Abc_ObjIsPo(pObj) );
                if ( !Abc_ObjIsPo(pObj) )
                    Abc_Print( 1, "Abc_NtkToDar(): Temporary bug: The PO ordering is wrong!\n" );
            }
            else
                assert( Abc_ObjIsBi(pObj) );
        // print warning about initial values
        nDontCares = 0;
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Abc_LatchIsInitDc(pObj) )
            {
                Abc_LatchSetInit0(pObj);
                nDontCares++;
            }
        if ( nDontCares )
        {
            Abc_Print( 1, "Warning: %d registers in this network have don't-care init values.\n", nDontCares );
            Abc_Print( 1, "The don't-care are assumed to be 0. The result may not verify.\n" );
            Abc_Print( 1, "Use command \"print_latch\" to see the init values of registers.\n" );
            Abc_Print( 1, "Use command \"zero\" to convert or \"init\" to change the values.\n" );
        }
    }
    // create the manager
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->fCatchExor = fExors;
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
        // initialize logic level of the CIs
        ((Aig_Obj_t *)pObj->pCopy)->Level = pObj->Level;
    }

    // complement the 1-values registers
    if ( fRegisters ) {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Abc_LatchIsInit1(pObj) )
                Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNot(Abc_ObjFanout0(pObj)->pCopy);
    }
    // perform the conversion of the internal nodes (assumes DFS ordering)
//    pMan->fAddStrash = 1;
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
//    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
//        Abc_Print( 1, "%d->%d ", pObj->Id, ((Aig_Obj_t *)pObj->pCopy)->Id );
    }
    Vec_PtrFree( vNodes );
    pMan->fAddStrash = 0;
    // create the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj) );
    // complement the 1-valued registers
    Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
    if ( fRegisters )
        Aig_ManForEachLiSeq( pMan, pObjNew, i )
            if ( Abc_LatchIsInit1(Abc_ObjFanout0(Abc_NtkCo(pNtk,i))) )
                pObjNew->pFanin0 = Aig_Not(pObjNew->pFanin0);
    // remove dangling nodes
    nNodes = (Abc_NtkGetChoiceNum(pNtk) == 0)? Aig_ManCleanup( pMan ) : 0;
    if ( !fExors && nNodes )
        Abc_Print( 1, "Abc_NtkToDar(): Unexpected %d dangling nodes when converting to AIG!\n", nNodes );
//Aig_ManDumpVerilog( pMan, "test.v" );
    // save the number of registers
    if ( fRegisters )
    {
        Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
        pMan->vFlopNums = Vec_IntStartNatural( pMan->nRegs );
//        pMan->vFlopNums = NULL;
//        pMan->vOnehots = Abc_NtkConverLatchNamesIntoNumbers( pNtk );
        if ( pNtk->vOnehots )
            pMan->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    }
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDar: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}